

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void remove_damage(monst *shkp,boolean croaked)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  xchar xVar5;
  boolean bVar6;
  char cVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  char *local_58;
  uint local_44;
  char local_3f;
  char local_3e;
  int disposition;
  char shops [5];
  xchar y;
  level *plStack_38;
  xchar x;
  level *lev;
  uchar saw_walls;
  boolean saw_untrap;
  boolean stop_picking;
  boolean saw_floor;
  boolean saw_door;
  damage *pdStack_28;
  boolean did_repair;
  damage *tmp2_dam;
  damage *tmp_dam;
  boolean croaked_local;
  monst *shkp_local;
  
  bVar1 = false;
  bVar2 = false;
  bVar3 = false;
  lev._4_1_ = '\0';
  bVar4 = false;
  lev._2_1_ = 0;
  xVar5 = ledger_no((d_level *)&shkp[0x1b].mxlth);
  plStack_38 = levels[xVar5];
  tmp2_dam = plStack_38->damagelist;
  pdStack_28 = (damage *)0x0;
  while (tmp2_dam != (damage *)0x0) {
    disposition._3_1_ = (tmp2_dam->place).x;
    disposition._2_1_ = (tmp2_dam->place).y;
    local_44 = 0;
    pcVar9 = in_rooms(plStack_38,disposition._3_1_,disposition._2_1_,0x12);
    strcpy(&local_3f,pcVar9);
    pcVar9 = strchr(&local_3f,(int)(char)shkp[0x1b].meating);
    if (pcVar9 != (char *)0x0) {
      if (croaked == '\0') {
        if (lev._4_1_ == '\0') {
          bVar6 = closed_door(plStack_38,(int)disposition._3_1_,(int)disposition._2_1_);
          if (bVar6 != '\0') {
            lev._4_1_ = picking_at((int)disposition._3_1_,(int)disposition._2_1_);
          }
          local_44 = repair_damage(plStack_38,shkp,tmp2_dam,'\0');
          if (local_44 == 0) {
            lev._4_1_ = '\0';
          }
        }
        else {
          local_44 = repair_damage(plStack_38,shkp,tmp2_dam,'\0');
        }
      }
      else {
        local_44 = (uint)(local_3e == '\0');
      }
    }
    if (local_44 == 0) {
      pdStack_28 = tmp2_dam;
      tmp2_dam = tmp2_dam->next;
    }
    else {
      if ((1 < (int)local_44) &&
         (bVar1 = true, (viz_array[disposition._2_1_][disposition._3_1_] & 2U) != 0)) {
        if ((plStack_38->locations[disposition._3_1_][disposition._2_1_].typ == '\0') ||
           ('\f' < plStack_38->locations[disposition._3_1_][disposition._2_1_].typ)) {
          if (plStack_38->locations[disposition._3_1_][disposition._2_1_].typ == '\x17') {
            bVar2 = true;
          }
          else if (local_44 == 3) {
            bVar4 = true;
          }
          else {
            bVar3 = true;
          }
        }
        else {
          lev._2_1_ = lev._2_1_ + 1;
        }
      }
      tmp2_dam = tmp2_dam->next;
      if (pdStack_28 == (damage *)0x0) {
        free(plStack_38->damagelist);
        plStack_38->damagelist = tmp2_dam;
      }
      else {
        free(pdStack_28->next);
        pdStack_28->next = tmp2_dam;
      }
    }
  }
  if (bVar1) {
    if (lev._2_1_ == 0) {
      if (bVar2) {
        pline("Suddenly, the shop door reappears!");
      }
      else if (bVar3) {
        pline("Suddenly, the floor damage is gone!");
      }
      else if (bVar4) {
        pline("Suddenly, the trap is removed from the floor!");
      }
      else {
        cVar7 = inside_shop(level,u.ux,u.uy);
        if (cVar7 == (char)shkp[0x1b].meating) {
          pline("You feel more claustrophobic than before.");
        }
        else if ((flags.soundok != '\0') && (iVar8 = rn2(10), iVar8 == 0)) {
          Norep("The dungeon acoustics noticeably change.");
        }
      }
    }
    else {
      if (lev._2_1_ == 1) {
        local_58 = "a";
      }
      else {
        local_58 = "several";
        if (lev._2_1_ < 4) {
          local_58 = "some";
        }
      }
      pcVar9 = "s";
      if (lev._2_1_ == 1) {
        pcVar9 = "";
      }
      pcVar10 = "";
      if (lev._2_1_ == 1) {
        pcVar10 = "s";
      }
      pline("Suddenly, %s section%s of wall close%s up!",local_58,pcVar9,pcVar10);
      if (bVar2) {
        pline("The shop door reappears!");
      }
      if (bVar3) {
        pline("The floor is repaired!");
      }
    }
    if (lev._4_1_ != '\0') {
      stop_occupation();
    }
  }
  return;
}

Assistant:

static void remove_damage(struct monst *shkp, boolean croaked)
{
	struct damage *tmp_dam, *tmp2_dam;
	boolean did_repair = FALSE, saw_door = FALSE;
	boolean saw_floor = FALSE, stop_picking = FALSE;
	boolean saw_untrap = FALSE;
	uchar saw_walls = 0;
	struct level *lev = levels[ledger_no(&ESHK(shkp)->shoplevel)];

	tmp_dam = lev->damagelist;
	tmp2_dam = 0;
	while (tmp_dam) {
	    xchar x = tmp_dam->place.x, y = tmp_dam->place.y;
	    char shops[5];
	    int disposition;

	    disposition = 0;
	    strcpy(shops, in_rooms(lev, x, y, SHOPBASE));
	    if (strchr(shops, ESHK(shkp)->shoproom)) {
		if (croaked)
		    disposition = (shops[1])? 0 : 1;
		else if (stop_picking)
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		else {
		    /* Defer the stop_occupation() until after repair msgs */
		    if (closed_door(lev, x, y))
			stop_picking = picking_at(x, y);
		    disposition = repair_damage(lev, shkp, tmp_dam, FALSE);
		    if (!disposition)
			stop_picking = FALSE;
		}
	    }

	    if (!disposition) {
		tmp2_dam = tmp_dam;
		tmp_dam = tmp_dam->next;
		continue;
	    }

	    if (disposition > 1) {
		did_repair = TRUE;
		if (cansee(x, y)) {
		    if (IS_WALL(lev->locations[x][y].typ))
			saw_walls++;
		    else if (IS_DOOR(lev->locations[x][y].typ))
			saw_door = TRUE;
		    else if (disposition == 3)		/* untrapped */
			saw_untrap = TRUE;
		    else
			saw_floor = TRUE;
		}
	    }

	    tmp_dam = tmp_dam->next;
	    if (!tmp2_dam) {
		free(lev->damagelist);
		lev->damagelist = tmp_dam;
	    } else {
		free(tmp2_dam->next);
		tmp2_dam->next = tmp_dam;
	    }
	}
	if (!did_repair)
	    return;
	if (saw_walls) {
	    pline("Suddenly, %s section%s of wall close%s up!",
		  (saw_walls == 1) ? "a" : (saw_walls <= 3) ?
						  "some" : "several",
		  (saw_walls == 1) ? "" : "s", (saw_walls == 1) ? "s" : "");
	    if (saw_door)
		pline("The shop door reappears!");
	    if (saw_floor)
		pline("The floor is repaired!");
	} else {
	    if (saw_door)
		pline("Suddenly, the shop door reappears!");
	    else if (saw_floor)
		pline("Suddenly, the floor damage is gone!");
	    else if (saw_untrap)
	        pline("Suddenly, the trap is removed from the floor!");
	    else if (inside_shop(level, u.ux, u.uy) == ESHK(shkp)->shoproom)
		pline("You feel more claustrophobic than before.");
	    else if (flags.soundok && !rn2(10))
		Norep("The dungeon acoustics noticeably change.");
	}
	if (stop_picking)
		stop_occupation();
}